

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
          *this,quad<unsigned_char> *param_1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  pixel_type *ppVar9;
  pixel_type *ppVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int qs;
  int qs_00;
  uint predicted;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int qs_01;
  uint index;
  uint uVar28;
  int qs_02;
  uint uVar29;
  uint uVar30;
  
  if (this->width_ != 0) {
    index = 0;
    do {
      ppVar9 = this->previous_line_;
      ppVar10 = this->current_line_;
      bVar12 = ppVar10[(long)(int)index + -1].super_triplet<unsigned_char>.field_0.v1;
      uVar24 = (uint)bVar12;
      bVar13 = ppVar10[(long)(int)index + -1].super_triplet<unsigned_char>.field_1.v2;
      uVar25 = (uint)bVar13;
      bVar14 = ppVar10[(long)(int)index + -1].super_triplet<unsigned_char>.field_2.v3;
      uVar26 = (uint)bVar14;
      bVar15 = ppVar10[(long)(int)index + -1].field_0.v4;
      uVar29 = (uint)bVar15;
      bVar1 = ppVar9[(long)(int)index + -1].super_triplet<unsigned_char>.field_0.v1;
      uVar19 = (uint)ppVar9[(long)(int)index + -1].super_triplet<unsigned_char>.field_1.v2;
      uVar20 = (uint)ppVar9[(long)(int)index + -1].super_triplet<unsigned_char>.field_2.v3;
      uVar21 = (uint)ppVar9[(long)(int)index + -1].field_0.v4;
      bVar2 = ppVar9[(int)index].super_triplet<unsigned_char>.field_0.v1;
      bVar3 = ppVar9[(int)index].super_triplet<unsigned_char>.field_1.v2;
      bVar4 = ppVar9[(int)index].super_triplet<unsigned_char>.field_2.v3;
      uVar22 = (uint)bVar4;
      bVar5 = ppVar9[(int)index].field_0.v4;
      uVar23 = (uint)bVar5;
      bVar6 = ppVar9[(long)(int)index + 1].super_triplet<unsigned_char>.field_1.v2;
      bVar7 = ppVar9[(long)(int)index + 1].super_triplet<unsigned_char>.field_2.v3;
      bVar8 = ppVar9[(long)(int)index + 1].field_0.v4;
      uVar28 = (uint)bVar2;
      iVar16 = quantize_gradient(this,ppVar9[(long)(int)index + 1].super_triplet<unsigned_char>.
                                      field_0.v1 - uVar28);
      uVar27 = (uint)bVar2 - (uint)bVar1;
      iVar17 = quantize_gradient(this,uVar27);
      iVar18 = quantize_gradient(this,bVar1 - uVar24);
      qs = (iVar16 * 9 + iVar17) * 9 + iVar18;
      uVar30 = (uint)bVar3;
      iVar16 = quantize_gradient(this,bVar6 - uVar30);
      iVar17 = quantize_gradient(this,bVar3 - uVar19);
      iVar18 = quantize_gradient(this,uVar19 - uVar25);
      qs_00 = (iVar16 * 9 + iVar17) * 9 + iVar18;
      iVar16 = quantize_gradient(this,bVar7 - uVar22);
      iVar17 = quantize_gradient(this,uVar22 - uVar20);
      iVar18 = quantize_gradient(this,uVar20 - uVar26);
      qs_02 = (iVar16 * 9 + iVar17) * 9 + iVar18;
      iVar16 = quantize_gradient(this,bVar8 - uVar23);
      iVar17 = quantize_gradient(this,uVar23 - uVar21);
      iVar18 = quantize_gradient(this,uVar21 - uVar29);
      qs_01 = (iVar16 * 9 + iVar17) * 9 + iVar18;
      if (((qs_00 == 0 && qs == 0) && qs_02 == 0) && qs_01 == 0) {
        iVar16 = do_run_mode(this,index,(encoder_strategy *)0x0);
        uVar29 = index + iVar16;
      }
      else {
        uVar11 = -(uint)(bVar2 < bVar12);
        predicted = uVar28;
        if ((-1 < (int)(bVar1 - uVar24 ^ uVar11)) &&
           (predicted = uVar24, -1 < (int)(uVar27 ^ uVar11))) {
          predicted = uVar28 + (uVar24 - bVar1);
        }
        bVar12 = do_regular(this,qs,(uint)this->current_line_[(int)index].
                                          super_triplet<unsigned_char>.field_0.v1,predicted,
                            (encoder_strategy *)0x0);
        uVar24 = -(uint)(bVar3 < bVar13);
        uVar27 = uVar30;
        if ((-1 < (int)(uVar19 - uVar25 ^ uVar24)) &&
           (uVar27 = uVar25, -1 < (int)(bVar3 - uVar19 ^ uVar24))) {
          uVar27 = uVar30 + (uVar25 - uVar19);
        }
        bVar13 = do_regular(this,qs_00,
                            (uint)this->current_line_[(int)index].super_triplet<unsigned_char>.
                                  field_1.v2,uVar27,(encoder_strategy *)0x0);
        uVar19 = -(uint)(bVar4 < bVar14);
        uVar24 = uVar22;
        if ((-1 < (int)(uVar20 - uVar26 ^ uVar19)) &&
           (uVar24 = uVar26, -1 < (int)(uVar22 - uVar20 ^ uVar19))) {
          uVar24 = uVar22 + (uVar26 - uVar20);
        }
        bVar14 = do_regular(this,qs_02,
                            (uint)this->current_line_[(int)index].super_triplet<unsigned_char>.
                                  field_2.v3,uVar24,(encoder_strategy *)0x0);
        uVar19 = -(uint)(bVar5 < bVar15);
        uVar20 = uVar23;
        if ((-1 < (int)(uVar21 - uVar29 ^ uVar19)) &&
           (uVar20 = uVar29, -1 < (int)(uVar23 - uVar21 ^ uVar19))) {
          uVar20 = uVar23 + (uVar29 - uVar21);
        }
        uVar29 = index + 1;
        bVar15 = do_regular(this,qs_01,(uint)this->current_line_[(int)index].field_0.v4,uVar20,
                            (encoder_strategy *)0x0);
        this->current_line_[(int)index] =
             (pixel_type)
             ((uint)bVar12 | (uint)bVar13 << 8 | (uint)bVar14 << 0x10 | (uint)bVar15 << 0x18);
      }
      index = uVar29;
    } while (uVar29 < this->width_);
  }
  return;
}

Assistant:

void do_line(quad<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const quad<sample_type> ra{current_line_[index - 1]};
            const quad<sample_type> rc{previous_line_[index - 1]};
            const quad<sample_type> rb{previous_line_[index]};
            const quad<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};
            const int32_t qs4{compute_context_id(quantize_gradient(rd.v4 - rb.v4), quantize_gradient(rb.v4 - rc.v4),
                                                 quantize_gradient(rc.v4 - ra.v4))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0 && qs4 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                quad<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                rx.v4 = do_regular(qs4, current_line_[index].v4, get_predicted_value(ra.v4, rb.v4, rc.v4),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }